

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdi::SimpleCascader::rearrange(SimpleCascader *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QStyleOptionTitleBar *this_00;
  const_reference ppQVar11;
  int *piVar12;
  QSize *asize;
  qsizetype qVar13;
  QList<QWidget_*> *in_RSI;
  long in_FS_OFFSET;
  QWidget *widget;
  int y;
  int x;
  int col;
  int row;
  int i;
  int dcol;
  int ncols;
  int nrows;
  int n;
  int dy;
  int titleBarHeight;
  int dx;
  int rightOffset;
  int leftOffset;
  int bottomOffset;
  int topOffset;
  QRect newGeometry;
  QFontMetrics fontMetrics;
  QStyleOptionTitleBar options;
  QWidget *in_stack_fffffffffffffe98;
  QList<QWidget_*> *in_stack_fffffffffffffea0;
  QWidget *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec4;
  QWidget *pQVar14;
  int iVar15;
  int iVar16;
  int local_120;
  int local_a8;
  int local_a4 [3];
  int local_98;
  int local_94;
  undefined1 *local_90;
  QFont local_88 [16];
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x60c13e);
  if (!bVar2) {
    memset(local_78,0xaa,0x70);
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0x60c195);
    QList<QWidget_*>::at(in_stack_fffffffffffffea0,(qsizetype)in_stack_fffffffffffffe98);
    QStyleOption::initFrom
              ((QStyleOption *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    QList<QWidget_*>::at(in_stack_fffffffffffffea0,(qsizetype)in_stack_fffffffffffffe98);
    this_00 = (QStyleOptionTitleBar *)QWidget::style(in_stack_fffffffffffffe98);
    ppQVar11 = QList<QWidget_*>::at
                         ((QList<QWidget_*> *)this_00,(qsizetype)in_stack_fffffffffffffe98);
    iVar3 = (**(code **)&(*(Data **)&(this_00->super_QStyleOptionComplex).super_QStyleOption)[0xe].
                         super_QArrayData)(this_00,0x1a,local_78,*ppQVar11);
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::font((char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_90,local_88);
    QFont::~QFont(local_88);
    iVar4 = QFontMetrics::height();
    local_94 = iVar3 - (iVar3 - iVar4) / 2;
    local_98 = 1;
    piVar12 = qMax<int>(&local_94,&local_98);
    iVar3 = *piVar12;
    QList<QWidget_*>::at((QList<QWidget_*> *)this_00,(qsizetype)in_stack_fffffffffffffe98);
    asize = (QSize *)QWidget::style(in_stack_fffffffffffffe98);
    ppQVar11 = QList<QWidget_*>::at
                         ((QList<QWidget_*> *)this_00,(qsizetype)in_stack_fffffffffffffe98);
    iVar5 = (**(code **)((long)*asize + 0xe0))(asize,0x40,0,*ppQVar11);
    iVar5 = iVar3 + iVar5;
    qVar13 = QList<QWidget_*>::size(in_RSI);
    iVar6 = (int)qVar13;
    iVar4 = QRect::height((QRect *)in_stack_fffffffffffffe98);
    local_a4[2] = (iVar4 + -0x32) / iVar5;
    local_a4[1] = 1;
    piVar12 = qMax<int>(local_a4 + 2,local_a4 + 1);
    iVar4 = *piVar12;
    iVar7 = iVar6 / iVar4;
    local_a4[0] = iVar7 + (uint)(iVar6 % iVar4 != 0);
    local_a8 = 1;
    piVar12 = qMax<int>(local_a4,&local_a8);
    iVar1 = *piVar12;
    iVar8 = QRect::width((QRect *)in_stack_fffffffffffffe98);
    local_120 = 0;
    for (iVar16 = 0; iVar16 < iVar4; iVar16 = iVar16 + 1) {
      for (iVar15 = 0; iVar15 < iVar1; iVar15 = iVar15 + 1) {
        iVar9 = iVar16 * 10 + iVar15 * ((iVar8 + -100) / iVar1);
        iVar10 = iVar16 * iVar5;
        bVar2 = sanityCheck((QList<QWidget_*> *)CONCAT44(in_stack_fffffffffffffec4,iVar7),iVar3,
                            (char *)asize);
        if (bVar2) {
          local_120 = local_120 + 1;
          ppQVar11 = QList<QWidget_*>::at
                               ((QList<QWidget_*> *)this_00,(qsizetype)in_stack_fffffffffffffe98);
          pQVar14 = *ppQVar11;
          QPoint::QPoint((QPoint *)this_00,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (int)in_stack_fffffffffffffe98);
          (**(code **)(*(long *)pQVar14 + 0x70))();
          in_stack_fffffffffffffe98 = pQVar14;
          QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffec4,iVar7),
                       (QPoint *)CONCAT44(iVar3,in_stack_fffffffffffffeb8),asize);
          pQVar14 = in_stack_fffffffffffffe98;
          QWidget::layoutDirection((QWidget *)0x60c4d6);
          QStyle::visualRect((LayoutDirection)((ulong)pQVar14 >> 0x20),
                             (QRect *)CONCAT44(in_stack_fffffffffffffec4,iVar7),
                             (QRect *)CONCAT44(iVar3,in_stack_fffffffffffffeb8));
          QWidget::setGeometry((QWidget *)CONCAT44(iVar16,iVar15),(QRect *)CONCAT44(iVar9,iVar10));
          if (local_120 == iVar6) goto LAB_0060c54b;
        }
      }
    }
LAB_0060c54b:
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_90);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SimpleCascader::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    // Tunables:
    const int topOffset = 0;
    const int bottomOffset = 50;
    const int leftOffset = 0;
    const int rightOffset = 100;
    const int dx = 10;

    QStyleOptionTitleBar options;
    options.initFrom(widgets.at(0));
    int titleBarHeight = widgets.at(0)->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, widgets.at(0));
    const QFontMetrics fontMetrics = QFontMetrics(QApplication::font("QMdiSubWindowTitleBar"));
    const int dy = qMax(titleBarHeight - (titleBarHeight - fontMetrics.height()) / 2, 1)
        + widgets.at(0)->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, nullptr, widgets.at(0));

    const int n = widgets.size();
    const int nrows = qMax((domain.height() - (topOffset + bottomOffset)) / dy, 1);
    const int ncols = qMax(n / nrows + ((n % nrows) ? 1 : 0), 1);
    const int dcol = (domain.width() - (leftOffset + rightOffset)) / ncols;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = leftOffset + row * dx + col * dcol;
            const int y = topOffset + row * dy;
            if (!sanityCheck(widgets, i, "SimpleCascader"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x, y), widget->sizeHint());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}